

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O3

ze_result_t
loader::zeCommandListGetDeviceHandle
          (ze_command_list_handle_t hCommandList,ze_device_handle_t *phDevice)

{
  ze_pfnCommandListGetDeviceHandle_t p_Var1;
  ze_result_t zVar2;
  object_t<_ze_device_handle_t_*> *poVar3;
  dditable_t *dditable;
  dditable_t *local_10;
  
  local_10 = *(dditable_t **)(hCommandList + 8);
  p_Var1 = (local_10->ze).CommandList.pfnGetDeviceHandle;
  if (p_Var1 == (ze_pfnCommandListGetDeviceHandle_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar2 = (*p_Var1)(*(ze_command_list_handle_t *)hCommandList,phDevice);
    if (zVar2 == ZE_RESULT_SUCCESS) {
      poVar3 = singleton_factory_t<object_t<_ze_device_handle_t*>,_ze_device_handle_t*>::
               getInstance<_ze_device_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_device_handle_t*>,_ze_device_handle_t*>
                           *)(context + 0x120),phDevice,&local_10);
      *phDevice = (ze_device_handle_t)poVar3;
      zVar2 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListGetDeviceHandle(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_device_handle_t* phDevice                    ///< [out] handle of the device on which the command list was created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnGetDeviceHandle = dditable->ze.CommandList.pfnGetDeviceHandle;
        if( nullptr == pfnGetDeviceHandle )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // forward to device-driver
        result = pfnGetDeviceHandle( hCommandList, phDevice );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phDevice = reinterpret_cast<ze_device_handle_t>(
                context->ze_device_factory.getInstance( *phDevice, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }